

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

double __thiscall libDAI::TFactor<double>::log(TFactor<double> *this,double __x)

{
  VarSet *in_RSI;
  double __x_00;
  double extraout_XMM0_Qa;
  _Vector_base<double,_std::allocator<double>_> _Stack_28;
  
  TFactor(this);
  VarSet::operator=(&this->_vs,in_RSI);
  TProb<double>::log((TProb<double> *)&_Stack_28,__x_00);
  TProb<double>::operator=(&this->_p,(TProb<double> *)&_Stack_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_28);
  return extraout_XMM0_Qa;
}

Assistant:

TFactor<T> log() const {
                TFactor<T> l; 
                l._vs = _vs; 
                l._p = _p.log(); 
                return l; 
            }